

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void __thiscall capnp::_::OrphanBuilder::truncateText(OrphanBuilder *this,ElementCount size)

{
  CapTableBuilder *capTable;
  uint uVar1;
  BuilderArena *arena;
  OrphanBuilder local_38;
  ElementCount local_14;
  OrphanBuilder *pOStack_10;
  ElementCount size_local;
  OrphanBuilder *this_local;
  
  local_14 = size;
  pOStack_10 = this;
  uVar1 = truncate(this,(char *)(ulong)size,1);
  if ((uVar1 & 1) == 0) {
    arena = SegmentBuilder::getArena(this->segment);
    capTable = this->capTable;
    uVar1 = assumeBits<29u,unsigned_int>(local_14);
    initText(&local_38,arena,capTable,uVar1);
    operator=(this,&local_38);
    ~OrphanBuilder(&local_38);
  }
  return;
}

Assistant:

void OrphanBuilder::truncateText(ElementCount size) {
  if (!truncate(size, true)) {
    // assumeBits() safe since it's checked inside truncate()
    *this = initText(segment->getArena(), capTable,
        assumeBits<LIST_ELEMENT_COUNT_BITS>(size) * (ONE * BYTES / ELEMENTS));
  }
}